

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceMemoryBase.cpp
# Opt level: O0

void Diligent::ValidateDeviceMemoryDesc(DeviceMemoryDesc *Desc,IRenderDevice *pDevice)

{
  int iVar1;
  undefined4 extraout_var;
  char *local_68;
  _func_int **local_60;
  _func_int **local_58;
  char *local_50;
  _func_int **local_48;
  _func_int **local_40;
  long local_38;
  SparseResourceProperties *SparseRes;
  IRenderDevice *pDevice_local;
  DeviceMemoryDesc *Desc_local;
  
  SparseRes = (SparseResourceProperties *)pDevice;
  pDevice_local = (IRenderDevice *)Desc;
  if (Desc->Type == DEVICE_MEMORY_TYPE_SPARSE) {
    iVar1 = (*(pDevice->super_IObject)._vptr_IObject[0x19])();
    local_38 = CONCAT44(extraout_var,iVar1) + 0x1a0;
    if (pDevice_local[2].super_IObject._vptr_IObject == (_func_int **)0x0) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_58 = (_func_int **)0xe30c4c;
      }
      else {
        local_58 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_40 = local_58;
      LogError<true,char[31],char_const*,char[15],char[27]>
                (false,"ValidateDeviceMemoryDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceMemoryBase.cpp"
                 ,0x31,(char (*) [31])"Description of device memory \'",(char **)&local_40,
                 (char (*) [15])"\' is invalid: ",(char (*) [27])"page size must not be zero");
    }
    if ((ulong)pDevice_local[2].super_IObject._vptr_IObject % (ulong)*(uint *)(local_38 + 0x14) != 0
       ) {
      if ((pDevice_local->super_IObject)._vptr_IObject == (_func_int **)0x0) {
        local_60 = (_func_int **)0xe30c4c;
      }
      else {
        local_60 = (pDevice_local->super_IObject)._vptr_IObject;
      }
      local_48 = local_60;
      LogError<true,char[31],char_const*,char[15],char[12],unsigned_long,char[43],unsigned_int,char[2]>
                (false,"ValidateDeviceMemoryDesc",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceMemoryBase.cpp"
                 ,0x36,(char (*) [31])"Description of device memory \'",(char **)&local_48,
                 (char (*) [15])"\' is invalid: ",(char (*) [12])0xe59900,
                 (unsigned_long *)(pDevice_local + 2),
                 (char (*) [43])") is not a multiple of sparse block size (",
                 (uint *)(local_38 + 0x14),(char (*) [2])0xf65f2d);
    }
  }
  else {
    if ((Desc->super_DeviceObjectAttribs).Name == (Char *)0x0) {
      local_68 = "";
    }
    else {
      local_68 = (Desc->super_DeviceObjectAttribs).Name;
    }
    local_50 = local_68;
    LogError<true,char[31],char_const*,char[15],char[30]>
              (false,"ValidateDeviceMemoryDesc",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceMemoryBase.cpp"
               ,0x3a,(char (*) [31])"Description of device memory \'",&local_50,
               (char (*) [15])"\' is invalid: ",(char (*) [30])"Unexpected device memory type");
  }
  return;
}

Assistant:

void ValidateDeviceMemoryDesc(const DeviceMemoryDesc& Desc, const IRenderDevice* pDevice) noexcept(false)
{
    if (Desc.Type == DEVICE_MEMORY_TYPE_SPARSE)
    {
        const auto& SparseRes = pDevice->GetAdapterInfo().SparseResources;

        VERIFY_DEVMEMORY(Desc.PageSize != 0, "page size must not be zero");

        // In a very rare case when the resource has a custom memory alignment that is not a multiple of StandardBlockSize,
        // this might be a false positive.
        VERIFY_DEVMEMORY((Desc.PageSize % SparseRes.StandardBlockSize) == 0,
                         "page size (", Desc.PageSize, ") is not a multiple of sparse block size (", SparseRes.StandardBlockSize, ")");
    }
    else
    {
        LOG_DEVMEMORY_ERROR_AND_THROW("Unexpected device memory type");
    }
}